

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<long_double,_unsigned_long>::Run
          (DataTransform<long_double,_unsigned_long> *this,istream *input_stream)

{
  NumericType NVar1;
  WarningType WVar2;
  ulong uVar3;
  char *__nptr;
  bool bVar4;
  int *piVar5;
  undefined8 uVar6;
  ostream *poVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  longdouble in_ST0;
  longdouble lVar13;
  longdouble lVar14;
  longdouble lVar15;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  string word;
  char buffer [128];
  string local_2a0;
  string *local_280;
  ulong local_278;
  ulong local_270;
  long local_268;
  ulong local_260;
  ulong local_258;
  ulong local_250;
  longdouble local_248;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_280 = &this->print_format_;
  iVar12 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        iVar11 = 2;
        bVar4 = false;
        lVar13 = in_ST0;
      }
      else {
        piVar5 = __errno_location();
        iVar11 = *piVar5;
        *piVar5 = 0;
        strtold(__nptr,(char **)&local_2a0);
        if (local_2a0._M_dataplus._M_p == __nptr) {
          uVar6 = std::__throw_invalid_argument("stold");
LAB_00148333:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar6);
        }
        if (*piVar5 == 0) {
          *piVar5 = iVar11;
        }
        else if (*piVar5 == 0x22) {
          uVar6 = std::__throw_out_of_range("stold");
          goto LAB_00148333;
        }
        iVar11 = 0;
        bVar4 = true;
        lVar13 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        local_248 = in_ST0;
      }
      in_ST0 = lVar13;
      if (local_230 != local_220) {
        operator_delete(local_230);
        in_ST0 = lVar13;
      }
      if (bVar4) {
LAB_00147f63:
        lVar14 = (longdouble)9.223372e+18;
        lVar13 = (longdouble)0;
        if (lVar14 <= local_248) {
          lVar13 = lVar14;
        }
        local_250 = (ulong)ROUND(local_248 - lVar13);
        uVar9 = (ulong)(lVar14 <= local_248) << 0x3f ^ local_250;
        uVar10 = this->minimum_value_;
        uVar3 = this->maximum_value_;
        if (uVar10 < uVar3) {
          NVar1 = this->input_numeric_type_;
          if (NVar1 == kFloatingPoint) {
            bVar4 = true;
            local_258 = uVar10;
            if (((longdouble)(long)uVar10 +
                 (longdouble)*(float *)(&DAT_00151b30 + (ulong)((long)uVar10 < 0) * 4) <= local_248)
               && (uVar10 = uVar3, local_260 = uVar3,
                  local_248 <=
                  (longdouble)(long)uVar3 +
                  (longdouble)*(float *)(&DAT_00151b30 + (ulong)((long)uVar3 < 0) * 4)))
            goto LAB_0014805b;
          }
          else if (NVar1 == kUnsignedInteger) {
            bVar4 = true;
            if ((uVar10 <= uVar9) && (bVar4 = uVar3 < uVar9, uVar10 = uVar9, bVar4)) {
              uVar10 = uVar3;
            }
          }
          else {
            if (NVar1 != kSignedInteger) goto LAB_0014805b;
            local_268 = (long)ROUND(local_248);
            bVar4 = true;
            if (((long)uVar10 <= local_268) &&
               (bVar4 = (long)uVar3 < local_268, uVar10 = uVar9, (long)uVar3 < local_268)) {
              uVar10 = uVar3;
            }
          }
        }
        else {
LAB_0014805b:
          bVar4 = false;
          uVar10 = uVar9;
        }
        if ((!bVar4) && (this->rounding_ != false)) {
          if (local_248 <= (longdouble)0) {
            lVar14 = local_248 + (longdouble)-0.5;
            lVar15 = (longdouble)9.223372e+18;
            lVar13 = (longdouble)0;
            if (lVar15 <= lVar14) {
              lVar13 = lVar15;
            }
            local_270 = (ulong)ROUND(lVar14 - lVar13);
            uVar10 = (ulong)(lVar15 <= lVar14) << 0x3f ^ local_270;
          }
          else {
            lVar14 = local_248 + (longdouble)0.5;
            lVar15 = (longdouble)9.223372e+18;
            lVar13 = (longdouble)0;
            if (lVar15 <= lVar14) {
              lVar13 = lVar15;
            }
            local_278 = (ulong)ROUND(lVar14 - lVar13);
            uVar10 = (ulong)(lVar15 <= lVar14) << 0x3f ^ local_278;
          }
        }
        in_ST5 = in_ST4;
        in_ST6 = in_ST4;
        in_ST7 = in_ST4;
        if ((bool)(bVar4 & this->warning_type_ != kIgnore)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar12);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"th data is over the range of output type",0x28);
          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"x2x","");
          sptk::PrintErrorMessage(&local_2a0,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p);
          }
          WVar2 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          iVar11 = 1;
          if (WVar2 == kExit) goto LAB_00148286;
        }
        if (this->is_ascii_output_ == true) {
          bVar4 = sptk::SnPrintf<unsigned_long>(uVar10,local_280,0x80,local_b8);
          iVar11 = 1;
          if (bVar4) {
            sVar8 = strlen(local_b8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar8)
            ;
            if ((iVar12 + 1) % this->num_column_ == 0) {
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
              std::ostream::put(-0x78);
              std::ostream::flush();
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
            }
LAB_00148284:
            iVar11 = 0;
          }
        }
        else {
          bVar4 = sptk::WriteStream<unsigned_long>(uVar10,(ostream *)&std::cout);
          iVar11 = 1;
          if (bVar4) goto LAB_00148284;
        }
      }
    }
    else {
      bVar4 = sptk::ReadStream<long_double>(&local_248,input_stream);
      iVar11 = 2;
      if (bVar4) goto LAB_00147f63;
    }
LAB_00148286:
    if (iVar11 != 0) {
      if (iVar11 == 2) {
        bVar4 = true;
        if ((this->is_ascii_output_ == true) && (iVar12 % this->num_column_ != 0)) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
      }
      else {
        bVar4 = false;
      }
      return bVar4;
    }
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }